

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::DWARFYAML::PubEntry,std::allocator<llvm::DWARFYAML::PubEntry>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,
          vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_> *Seq,
          bool param_3,EmptyContext *Ctx)

{
  char cVar1;
  uint uVar2;
  type *io_00;
  undefined7 in_register_00000009;
  ulong index;
  undefined8 local_40;
  void *SaveInfo;
  
  SaveInfo = (void *)CONCAT71(in_register_00000009,param_3);
  uVar2 = (**(code **)(*(long *)this + 0x18))();
  cVar1 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar1 != '\0') {
    uVar2 = (uint)(((long)io->Ctxt - (long)io->_vptr_IO) / 0x18);
  }
  for (index = 0; uVar2 != index; index = index + 1) {
    cVar1 = (**(code **)(*(long *)this + 0x20))(this,index & 0xffffffff,&local_40);
    if (cVar1 != '\0') {
      io_00 = SequenceTraitsImpl<std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>,_false>
              ::element((IO *)this,
                        (vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                         *)io,index);
      yamlize<llvm::DWARFYAML::PubEntry,llvm::yaml::EmptyContext>
                (this,(IO *)io_00,(PubEntry *)0x1,SUB81(SaveInfo,0),Ctx);
      (**(code **)(*(long *)this + 0x28))(this,local_40);
    }
  }
  (**(code **)(*(long *)this + 0x30))(this);
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}